

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option-parser.cc
# Opt level: O1

void __thiscall wabt::OptionParser::Errorf(OptionParser *this,char *format,...)

{
  pointer pcVar1;
  size_type sVar2;
  _Invoker_type p_Var3;
  long lVar4;
  size_type *psVar5;
  int iVar6;
  char *__s;
  size_t __maxlen;
  undefined8 uStack_1c0;
  char local_1b8 [8];
  char fixed_buf [128];
  undefined8 local_88;
  va_list args;
  size_type *local_68;
  string msg;
  va_list args_copy;
  
  __s = local_1b8;
  args[0].overflow_arg_area = fixed_buf + 0x78;
  local_88 = 0x3000000010;
  args[0]._0_8_ = &stack0x00000008;
  msg.field_2._8_8_ = 0x3000000010;
  uStack_1c0 = 0x12cf74;
  args_copy[0]._0_8_ = args[0]._0_8_;
  args_copy[0].overflow_arg_area = args[0].overflow_arg_area;
  iVar6 = vsnprintf(local_1b8,0x80,format,&local_88);
  __maxlen = (long)iVar6 + 1;
  if (0x80 < __maxlen) {
    lVar4 = -((long)iVar6 + 0x10U & 0xfffffffffffffff0);
    __s = local_1b8 + lVar4;
    *(undefined8 *)((long)&uStack_1c0 + lVar4) = 0x12cfa3;
    vsnprintf(__s,__maxlen,format,(__gnuc_va_list)((long)&msg.field_2 + 8));
  }
  pcVar1 = (this->program_name_)._M_dataplus._M_p;
  sVar2 = (this->program_name_)._M_string_length;
  local_68 = &msg._M_string_length;
  __s[-8] = -0x3e;
  __s[-7] = -0x31;
  __s[-6] = '\x12';
  __s[-5] = '\0';
  __s[-4] = '\0';
  __s[-3] = '\0';
  __s[-2] = '\0';
  __s[-1] = '\0';
  std::__cxx11::string::_M_construct<char*>((string *)&local_68,pcVar1,pcVar1 + sVar2);
  __s[-8] = -0x2f;
  __s[-7] = -0x31;
  __s[-6] = '\x12';
  __s[-5] = '\0';
  __s[-4] = '\0';
  __s[-3] = '\0';
  __s[-2] = '\0';
  __s[-1] = '\0';
  std::__cxx11::string::append((char *)&local_68);
  __s[-8] = -0x24;
  __s[-7] = -0x31;
  __s[-6] = '\x12';
  __s[-5] = '\0';
  __s[-4] = '\0';
  __s[-3] = '\0';
  __s[-2] = '\0';
  __s[-1] = '\0';
  std::__cxx11::string::append((char *)&local_68);
  __s[-8] = -0x15;
  __s[-7] = -0x31;
  __s[-6] = '\x12';
  __s[-5] = '\0';
  __s[-4] = '\0';
  __s[-3] = '\0';
  __s[-2] = '\0';
  __s[-1] = '\0';
  std::__cxx11::string::append((char *)&local_68);
  args_copy[0].reg_save_area = local_68;
  if ((this->on_error_).super__Function_base._M_manager != (_Manager_type)0x0) {
    p_Var3 = (this->on_error_)._M_invoker;
    __s[-8] = '\n';
    __s[-7] = -0x30;
    __s[-6] = '\x12';
    __s[-5] = '\0';
    __s[-4] = '\0';
    __s[-3] = '\0';
    __s[-2] = '\0';
    __s[-1] = '\0';
    (*p_Var3)((_Any_data *)&this->on_error_,(char **)&args_copy[0].reg_save_area);
    psVar5 = local_68;
    if (local_68 != &msg._M_string_length) {
      __s[-8] = '\x1f';
      __s[-7] = -0x30;
      __s[-6] = '\x12';
      __s[-5] = '\0';
      __s[-4] = '\0';
      __s[-3] = '\0';
      __s[-2] = '\0';
      __s[-1] = '\0';
      operator_delete(psVar5,msg._M_string_length + 1);
    }
    return;
  }
  __s[-8] = '1';
  __s[-7] = -0x30;
  __s[-6] = '\x12';
  __s[-5] = '\0';
  __s[-4] = '\0';
  __s[-3] = '\0';
  __s[-2] = '\0';
  __s[-1] = '\0';
  std::__throw_bad_function_call();
}

Assistant:

void OptionParser::Errorf(const char* format, ...) {
  WABT_SNPRINTF_ALLOCA(buffer, length, format);
  std::string msg(program_name_);
  msg += ": ";
  msg += buffer;
  msg += "\nTry '--help' for more information.";
  on_error_(msg.c_str());
}